

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O0

void __thiscall MPEGSequenceHeader::MPEGSequenceHeader(MPEGSequenceHeader *this,int bufferSize)

{
  int bufferSize_local;
  MPEGSequenceHeader *this_local;
  
  MPEGRawDataHeader::MPEGRawDataHeader(&this->super_MPEGRawDataHeader,bufferSize);
  (this->super_MPEGRawDataHeader).super_MPEGHeader._vptr_MPEGHeader =
       (_func_int **)&PTR__MPEGSequenceHeader_00441f58;
  *(undefined2 *)&(this->super_MPEGRawDataHeader).field_0x1c = 0;
  *(undefined2 *)&(this->super_MPEGRawDataHeader).field_0x1e = 0;
  this->aspect_ratio_info = '\0';
  this->frame_rate_index = '\0';
  this->bit_rate = 0;
  this->rc_buffer_size = 0;
  *(ushort *)&this->field_0x2c = *(ushort *)&this->field_0x2c & 0xfc00;
  this->field_0x2d = this->field_0x2d & 0xfb;
  this->load_intra_matrix = false;
  this->load_non_intra_matrix = false;
  this->intra_matrix[0x30] = '\0';
  this->intra_matrix[0x31] = '\0';
  this->intra_matrix[0x32] = '\0';
  this->intra_matrix[0x33] = '\0';
  this->intra_matrix[0x34] = '\0';
  this->intra_matrix[0x35] = '\0';
  this->intra_matrix[0x36] = '\0';
  this->intra_matrix[0x37] = '\0';
  this->intra_matrix[0x38] = '\0';
  this->intra_matrix[0x39] = '\0';
  this->intra_matrix[0x3a] = '\0';
  this->intra_matrix[0x3b] = '\0';
  this->intra_matrix[0x3c] = '\0';
  this->intra_matrix[0x3d] = '\0';
  this->intra_matrix[0x3e] = '\0';
  this->intra_matrix[0x3f] = '\0';
  this->intra_matrix[0x20] = '\0';
  this->intra_matrix[0x21] = '\0';
  this->intra_matrix[0x22] = '\0';
  this->intra_matrix[0x23] = '\0';
  this->intra_matrix[0x24] = '\0';
  this->intra_matrix[0x25] = '\0';
  this->intra_matrix[0x26] = '\0';
  this->intra_matrix[0x27] = '\0';
  this->intra_matrix[0x28] = '\0';
  this->intra_matrix[0x29] = '\0';
  this->intra_matrix[0x2a] = '\0';
  this->intra_matrix[0x2b] = '\0';
  this->intra_matrix[0x2c] = '\0';
  this->intra_matrix[0x2d] = '\0';
  this->intra_matrix[0x2e] = '\0';
  this->intra_matrix[0x2f] = '\0';
  this->intra_matrix[0x10] = '\0';
  this->intra_matrix[0x11] = '\0';
  this->intra_matrix[0x12] = '\0';
  this->intra_matrix[0x13] = '\0';
  this->intra_matrix[0x14] = '\0';
  this->intra_matrix[0x15] = '\0';
  this->intra_matrix[0x16] = '\0';
  this->intra_matrix[0x17] = '\0';
  this->intra_matrix[0x18] = '\0';
  this->intra_matrix[0x19] = '\0';
  this->intra_matrix[0x1a] = '\0';
  this->intra_matrix[0x1b] = '\0';
  this->intra_matrix[0x1c] = '\0';
  this->intra_matrix[0x1d] = '\0';
  this->intra_matrix[0x1e] = '\0';
  this->intra_matrix[0x1f] = '\0';
  this->intra_matrix[0] = '\0';
  this->intra_matrix[1] = '\0';
  this->intra_matrix[2] = '\0';
  this->intra_matrix[3] = '\0';
  this->intra_matrix[4] = '\0';
  this->intra_matrix[5] = '\0';
  this->intra_matrix[6] = '\0';
  this->intra_matrix[7] = '\0';
  this->intra_matrix[8] = '\0';
  this->intra_matrix[9] = '\0';
  this->intra_matrix[10] = '\0';
  this->intra_matrix[0xb] = '\0';
  this->intra_matrix[0xc] = '\0';
  this->intra_matrix[0xd] = '\0';
  this->intra_matrix[0xe] = '\0';
  this->intra_matrix[0xf] = '\0';
  this->non_intra_matrix[0x30] = '\0';
  this->non_intra_matrix[0x31] = '\0';
  this->non_intra_matrix[0x32] = '\0';
  this->non_intra_matrix[0x33] = '\0';
  this->non_intra_matrix[0x34] = '\0';
  this->non_intra_matrix[0x35] = '\0';
  this->non_intra_matrix[0x36] = '\0';
  this->non_intra_matrix[0x37] = '\0';
  this->non_intra_matrix[0x38] = '\0';
  this->non_intra_matrix[0x39] = '\0';
  this->non_intra_matrix[0x3a] = '\0';
  this->non_intra_matrix[0x3b] = '\0';
  this->non_intra_matrix[0x3c] = '\0';
  this->non_intra_matrix[0x3d] = '\0';
  this->non_intra_matrix[0x3e] = '\0';
  this->non_intra_matrix[0x3f] = '\0';
  this->non_intra_matrix[0x20] = '\0';
  this->non_intra_matrix[0x21] = '\0';
  this->non_intra_matrix[0x22] = '\0';
  this->non_intra_matrix[0x23] = '\0';
  this->non_intra_matrix[0x24] = '\0';
  this->non_intra_matrix[0x25] = '\0';
  this->non_intra_matrix[0x26] = '\0';
  this->non_intra_matrix[0x27] = '\0';
  this->non_intra_matrix[0x28] = '\0';
  this->non_intra_matrix[0x29] = '\0';
  this->non_intra_matrix[0x2a] = '\0';
  this->non_intra_matrix[0x2b] = '\0';
  this->non_intra_matrix[0x2c] = '\0';
  this->non_intra_matrix[0x2d] = '\0';
  this->non_intra_matrix[0x2e] = '\0';
  this->non_intra_matrix[0x2f] = '\0';
  this->non_intra_matrix[0x10] = '\0';
  this->non_intra_matrix[0x11] = '\0';
  this->non_intra_matrix[0x12] = '\0';
  this->non_intra_matrix[0x13] = '\0';
  this->non_intra_matrix[0x14] = '\0';
  this->non_intra_matrix[0x15] = '\0';
  this->non_intra_matrix[0x16] = '\0';
  this->non_intra_matrix[0x17] = '\0';
  this->non_intra_matrix[0x18] = '\0';
  this->non_intra_matrix[0x19] = '\0';
  this->non_intra_matrix[0x1a] = '\0';
  this->non_intra_matrix[0x1b] = '\0';
  this->non_intra_matrix[0x1c] = '\0';
  this->non_intra_matrix[0x1d] = '\0';
  this->non_intra_matrix[0x1e] = '\0';
  this->non_intra_matrix[0x1f] = '\0';
  this->non_intra_matrix[0] = '\0';
  this->non_intra_matrix[1] = '\0';
  this->non_intra_matrix[2] = '\0';
  this->non_intra_matrix[3] = '\0';
  this->non_intra_matrix[4] = '\0';
  this->non_intra_matrix[5] = '\0';
  this->non_intra_matrix[6] = '\0';
  this->non_intra_matrix[7] = '\0';
  this->non_intra_matrix[8] = '\0';
  this->non_intra_matrix[9] = '\0';
  this->non_intra_matrix[10] = '\0';
  this->non_intra_matrix[0xb] = '\0';
  this->non_intra_matrix[0xc] = '\0';
  this->non_intra_matrix[0xd] = '\0';
  this->non_intra_matrix[0xe] = '\0';
  this->non_intra_matrix[0xf] = '\0';
  this->chroma_format = '\0';
  this->horiz_size_ext = '\0';
  this->vert_size_ext = '\0';
  this->bit_rate_ext = 0;
  this->low_delay = false;
  AVRational::AVRational(&this->frame_rate_ext);
  this->video_format = '\0';
  this->color_primaries = '\0';
  this->transfer_characteristics = '\0';
  this->matrix_coefficients = '\0';
  this->pan_scan_width = 0;
  this->pan_scan_height = 0;
  this->progressive_sequence = '\0';
  this->profile = -1;
  this->level = -1;
  return;
}

Assistant:

MPEGSequenceHeader::MPEGSequenceHeader(const int bufferSize)
    : MPEGRawDataHeader(bufferSize),
      width(0),
      height(0),
      aspect_ratio_info(0),
      frame_rate_index(0),
      bit_rate(0),
      rc_buffer_size(0),
      vbv_buffer_size(0),
      constParameterFlag(0),
      load_intra_matrix(false),
      load_non_intra_matrix(false),
      intra_matrix(),
      non_intra_matrix(),
      chroma_format(0),
      horiz_size_ext(0),
      vert_size_ext(0),
      bit_rate_ext(0),
      low_delay(false),
      video_format(0),
      color_primaries(0),
      transfer_characteristics(0),
      matrix_coefficients(0),
      pan_scan_width(0),
      pan_scan_height(0)
{
    progressive_sequence = false;
    profile = -1;
    level = -1;
}